

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O0

int can_fixup_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  u64 uVar4;
  netlink_ext_ack *in_RCX;
  can_bittiming_const *in_RDX;
  can_bittiming *in_RSI;
  net_device *in_RDI;
  u32 _tmp;
  uint32_t __rem_1;
  uint32_t __base_1;
  uint32_t __rem;
  uint32_t __base;
  int err;
  u64 brp64;
  can_priv *priv;
  uint tseg1;
  __u32 divisor;
  uint uVar5;
  ulong local_40;
  int local_4;
  
  uVar1 = in_RSI->prop_seg + in_RSI->phase_seg1;
  puVar3 = (uint *)netdev_priv(in_RDI);
  if (uVar1 < in_RDX->tseg1_min) {
    local_4 = -0x16;
  }
  else if (in_RDX->tseg1_max < uVar1) {
    local_4 = -0x16;
  }
  else if (in_RSI->phase_seg2 < in_RDX->tseg2_min) {
    local_4 = -0x16;
  }
  else if (in_RDX->tseg2_max < in_RSI->phase_seg2) {
    local_4 = -0x16;
  }
  else {
    can_sjw_set_default(in_RSI);
    local_4 = can_sjw_check(in_RDI,in_RSI,in_RDX,in_RCX);
    if (local_4 == 0) {
      local_40 = (ulong)*puVar3 * (ulong)in_RSI->tq;
      if (1 < in_RDX->brp_inc) {
        local_40 = local_40 / in_RDX->brp_inc;
      }
      local_40._0_4_ = (__u32)((local_40 + 499999999) / 1000000000);
      if (1 < in_RDX->brp_inc) {
        local_40._0_4_ = in_RDX->brp_inc * (__u32)local_40;
      }
      in_RSI->brp = (__u32)local_40;
      if (in_RSI->brp < in_RDX->brp_min) {
        local_4 = -0x16;
      }
      else if (in_RDX->brp_max < in_RSI->brp) {
        local_4 = -0x16;
      }
      else {
        uVar5 = *puVar3;
        divisor = in_RSI->brp;
        uVar2 = can_bit_time(in_RSI);
        in_RSI->bitrate = uVar5 / (divisor * uVar2);
        uVar1 = (uVar1 + 1) * 1000;
        uVar2 = can_bit_time(in_RSI);
        in_RSI->sample_point = uVar1 / uVar2;
        mul_u32_u32(in_RSI->brp,1000000000);
        uVar4 = div_u64(CONCAT44(uVar1,uVar5),divisor);
        in_RSI->tq = (__u32)uVar4;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int can_fixup_bittiming(const struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc,
			       struct netlink_ext_ack *extack)
{
	const unsigned int tseg1 = bt->prop_seg + bt->phase_seg1;
	const struct can_priv *priv = netdev_priv(dev);
	u64 brp64;
	int err;

	if (tseg1 < btc->tseg1_min) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u less than tseg1-min: %u",
				   tseg1, btc->tseg1_min);
		return -EINVAL;
	}
	if (tseg1 > btc->tseg1_max) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u greater than tseg1-max: %u",
				   tseg1, btc->tseg1_max);
		return -EINVAL;
	}
	if (bt->phase_seg2 < btc->tseg2_min) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u less than tseg2-min: %u",
				   bt->phase_seg2, btc->tseg2_min);
		return -EINVAL;
	}
	if (bt->phase_seg2 > btc->tseg2_max) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u greater than tseg2-max: %u",
				   bt->phase_seg2, btc->tseg2_max);
		return -EINVAL;
	}

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u less than brp-min: %u",
				   bt->brp, btc->brp_min);
		return -EINVAL;
	}
	if (bt->brp > btc->brp_max) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u greater than brp-max: %u",
				   bt->brp, btc->brp_max);
		return -EINVAL;
	}

	bt->bitrate = priv->clock.freq / (bt->brp * can_bit_time(bt));
	bt->sample_point = ((CAN_SYNC_SEG + tseg1) * 1000) / can_bit_time(bt);
	bt->tq = DIV_U64_ROUND_CLOSEST(mul_u32_u32(bt->brp, NSEC_PER_SEC),
				       priv->clock.freq);

	return 0;
}